

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O2

void TemplateCacheUnittest::TestTemplateSearchPath(void)

{
  size_t sVar1;
  _Alloc_hider _Var2;
  __type _Var3;
  bool bVar4;
  int iVar5;
  Template *pTVar6;
  long lVar7;
  TemplateString *this;
  allocator local_1e9;
  TemplateString local_1e8;
  TemplateCache cache2;
  size_t local_1c0;
  TemplateString local_188;
  string path_a_foo;
  string path_b_foo;
  string pathB;
  string pathA;
  TemplateCache cache1;
  string path_b_bar;
  TemplateDictionary dict;
  
  ctemplate::TemplateCache::TemplateCache(&cache1);
  std::__cxx11::string::string((string *)&dict,"a/",(allocator *)&cache2);
  ctemplate::PathJoin((string *)&pathA,(string *)ctemplate::FLAGS_test_tmpdir_abi_cxx11_);
  std::__cxx11::string::~string((string *)&dict);
  std::__cxx11::string::string((string *)&dict,"b/",(allocator *)&cache2);
  ctemplate::PathJoin((string *)&pathB,(string *)ctemplate::FLAGS_test_tmpdir_abi_cxx11_);
  std::__cxx11::string::~string((string *)&dict);
  ctemplate::CreateOrCleanTestDir(&pathA);
  ctemplate::CreateOrCleanTestDir(&pathB);
  ctemplate::TemplateString::TemplateString((TemplateString *)&cache2,"");
  ctemplate::TemplateDictionary::TemplateDictionary
            (&dict,(TemplateString *)&cache2,(UnsafeArena *)0x0);
  ctemplate::TemplateCache::SetTemplateRootDirectory((string *)&cache1);
  ctemplate::TemplateCache::AddAlternateTemplateRootDirectory((string *)&cache1);
  ctemplate::TemplateCache::template_root_directory_abi_cxx11_();
  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &cache2,&pathA);
  std::__cxx11::string::~string((string *)&cache2);
  if (_Var3) {
    std::__cxx11::string::string((string *)&cache2,"template_bar",(allocator *)&path_a_foo);
    ctemplate::PathJoin((string *)&path_b_bar,(string *)&pathB);
    std::__cxx11::string::~string((string *)&cache2);
    std::__cxx11::string::string((string *)&cache2,"b/template_bar",(allocator *)&path_a_foo);
    ctemplate::StringToFile((string *)&cache2,&path_b_bar);
    std::__cxx11::string::~string((string *)&cache2);
    _Var2 = path_b_bar._M_dataplus;
    std::__cxx11::string::string((string *)&path_a_foo,"template_bar",(allocator *)&path_b_foo);
    ctemplate::TemplateCache::FindTemplateFilename((string *)&cache2);
    iVar5 = strcmp(_Var2._M_p,_cache2);
    std::__cxx11::string::~string((string *)&cache2);
    std::__cxx11::string::~string((string *)&path_a_foo);
    if (iVar5 == 0) {
      ctemplate::TemplateString::TemplateString((TemplateString *)&cache2,"template_bar");
      pTVar6 = (Template *)
               ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache1,(Strip)&cache2);
      if (pTVar6 == (Template *)0x0) {
        printf("ASSERT FAILED, line %d: %s\n",0x118,"b_bar");
        __assert_fail("b_bar",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                      ,0x118,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
      }
      std::__cxx11::string::string((string *)&cache2,"b/template_bar",(allocator *)&path_a_foo);
      ctemplate::AssertExpandIs(pTVar6,&dict,(string *)&cache2,true);
      std::__cxx11::string::~string((string *)&cache2);
      std::__cxx11::string::string((string *)&cache2,"template_foo",(allocator *)&path_b_foo);
      ctemplate::PathJoin((string *)&path_a_foo,(string *)&pathA);
      std::__cxx11::string::~string((string *)&cache2);
      std::__cxx11::string::string((string *)&cache2,"template_foo",(allocator *)&local_1e8);
      ctemplate::PathJoin((string *)&path_b_foo,(string *)&pathB);
      std::__cxx11::string::~string((string *)&cache2);
      std::__cxx11::string::string((string *)&cache2,"a/template_foo",(allocator *)&local_1e8);
      ctemplate::StringToFile((string *)&cache2,&path_a_foo);
      std::__cxx11::string::~string((string *)&cache2);
      std::__cxx11::string::string((string *)&cache2,"b/template_foo",(allocator *)&local_1e8);
      ctemplate::StringToFile((string *)&cache2,&path_b_foo);
      std::__cxx11::string::~string((string *)&cache2);
      _Var2 = path_a_foo._M_dataplus;
      std::__cxx11::string::string((string *)&local_1e8,"template_foo",(allocator *)&local_188);
      ctemplate::TemplateCache::FindTemplateFilename((string *)&cache2);
      iVar5 = strcmp(_Var2._M_p,_cache2);
      std::__cxx11::string::~string((string *)&cache2);
      std::__cxx11::string::~string((string *)&local_1e8);
      if (iVar5 == 0) {
        ctemplate::TemplateString::TemplateString((TemplateString *)&cache2,"template_foo");
        pTVar6 = (Template *)
                 ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache1,(Strip)&cache2);
        if (pTVar6 == (Template *)0x0) {
          printf("ASSERT FAILED, line %d: %s\n",0x124,"a_foo");
          __assert_fail("a_foo",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                        ,0x124,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
        }
        std::__cxx11::string::string((string *)&cache2,"a/template_foo",(allocator *)&local_1e8);
        ctemplate::AssertExpandIs(pTVar6,&dict,(string *)&cache2,true);
        std::__cxx11::string::~string((string *)&cache2);
        std::__cxx11::string::string((string *)&local_1e8,"baz",(allocator *)&local_188);
        ctemplate::TemplateCache::FindTemplateFilename((string *)&cache2);
        std::__cxx11::string::~string((string *)&cache2);
        std::__cxx11::string::~string((string *)&local_1e8);
        if (local_1c0 != 0) {
          printf("ASSERT FAILED, line %d: %s\n",0x129,"cache1.FindTemplateFilename(\"baz\").empty()"
                );
          std::__cxx11::string::string((string *)&local_1e8,"baz",(allocator *)&local_188);
          ctemplate::TemplateCache::FindTemplateFilename((string *)&cache2);
          if (local_1c0 != 0) {
            __assert_fail("cache1.FindTemplateFilename(\"baz\").empty()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                          ,0x129,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
          }
          goto LAB_00109ef5;
        }
        ctemplate::TemplateCache::TemplateCache(&cache2);
        ctemplate::TemplateCache::SetTemplateRootDirectory((string *)&cache2);
        _Var2 = path_b_foo._M_dataplus;
        std::__cxx11::string::string((string *)&local_188,"template_foo",&local_1e9);
        ctemplate::TemplateCache::FindTemplateFilename((string *)&local_1e8);
        iVar5 = strcmp(_Var2._M_p,local_1e8.ptr_);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_188);
        if (iVar5 != 0) {
          printf("ASSERT FAILED, line %d: %s\n",0x12f,
                 "strcmp(path_b_foo.c_str(), cache2.FindTemplateFilename(\"template_foo\").c_str()) == 0"
                );
          std::__cxx11::string::string((string *)&local_188,"template_foo",&local_1e9);
          ctemplate::TemplateCache::FindTemplateFilename((string *)&local_1e8);
          iVar5 = strcmp(path_b_foo._M_dataplus._M_p,local_1e8.ptr_);
          if (iVar5 != 0) {
            __assert_fail("strcmp(path_b_foo.c_str(), cache2.FindTemplateFilename(\"template_foo\").c_str()) == 0"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                          ,0x12f,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
          }
LAB_0010a04b:
          std::__cxx11::string::~string((string *)&local_1e8);
          this = &local_188;
          goto LAB_0010a05a;
        }
        ctemplate::TemplateString::TemplateString(&local_1e8,"template_foo");
        pTVar6 = (Template *)
                 ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache2,(Strip)&local_1e8);
        if (pTVar6 == (Template *)0x0) {
          printf("ASSERT FAILED, line %d: %s\n",0x131,"b_foo");
          __assert_fail("b_foo",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                        ,0x131,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
        }
        std::__cxx11::string::string((string *)&local_1e8,"b/template_foo",(allocator *)&local_188);
        ctemplate::AssertExpandIs(pTVar6,&dict,(string *)&local_1e8,true);
        std::__cxx11::string::~string((string *)&local_1e8);
        ctemplate::Template::template_root_directory_abi_cxx11_();
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_1e8,(char *)&ctemplate::kCWD);
        std::__cxx11::string::~string((string *)&local_1e8);
        if (bVar4) {
          std::__cxx11::string::string((string *)&local_188,"template_foo",&local_1e9);
          ctemplate::Template::FindTemplateFilename((string *)&local_1e8,(string *)&local_188);
          sVar1 = local_1e8.length_;
          std::__cxx11::string::~string((string *)&local_1e8);
          std::__cxx11::string::~string((string *)&local_188);
          if (sVar1 == 0) {
            ctemplate::TemplateString::TemplateString(&local_1e8,"template_foo");
            lVar7 = ctemplate::Template::GetTemplate(&local_1e8,DO_NOT_STRIP);
            if (lVar7 == 0) {
              ctemplate::CreateOrCleanTestDir(&pathA);
              ctemplate::CreateOrCleanTestDir(&pathB);
              ctemplate::TemplateCache::~TemplateCache(&cache2);
              std::__cxx11::string::~string((string *)&path_b_foo);
              std::__cxx11::string::~string((string *)&path_a_foo);
              std::__cxx11::string::~string((string *)&path_b_bar);
              ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
              std::__cxx11::string::~string((string *)&pathB);
              std::__cxx11::string::~string((string *)&pathA);
              ctemplate::TemplateCache::~TemplateCache(&cache1);
              return;
            }
            printf("ASSERT FAILED, line %d: %s\n",0x137,
                   "!Template::GetTemplate(\"template_foo\", DO_NOT_STRIP)");
            ctemplate::TemplateString::TemplateString(&local_1e8,"template_foo");
            lVar7 = ctemplate::Template::GetTemplate(&local_1e8,DO_NOT_STRIP);
            if (lVar7 != 0) {
              __assert_fail("!Template::GetTemplate(\"template_foo\", DO_NOT_STRIP)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                            ,0x137,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
            }
            goto LAB_0010a05f;
          }
          printf("ASSERT FAILED, line %d: %s\n",0x136,
                 "Template::FindTemplateFilename(\"template_foo\").empty()");
          std::__cxx11::string::string((string *)&local_188,"template_foo",&local_1e9);
          ctemplate::Template::FindTemplateFilename((string *)&local_1e8,(string *)&local_188);
          if (local_1e8.length_ != 0) {
            __assert_fail("Template::FindTemplateFilename(\"template_foo\").empty()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                          ,0x136,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
          }
          goto LAB_0010a04b;
        }
        printf("ASSERT FAILED, line %d: %s\n",0x135,"Template::template_root_directory() == kCWD");
        ctemplate::Template::template_root_directory_abi_cxx11_();
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_1e8,(char *)&ctemplate::kCWD);
        if (!bVar4) {
          __assert_fail("Template::template_root_directory() == kCWD",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                        ,0x135,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
        }
      }
      else {
        printf("ASSERT FAILED, line %d: %s\n",0x122,
               "strcmp(path_a_foo.c_str(), cache1.FindTemplateFilename(\"template_foo\").c_str()) == 0"
              );
        std::__cxx11::string::string((string *)&local_1e8,"template_foo",(allocator *)&local_188);
        ctemplate::TemplateCache::FindTemplateFilename((string *)&cache2);
        iVar5 = strcmp(path_a_foo._M_dataplus._M_p,_cache2);
        if (iVar5 != 0) {
          __assert_fail("strcmp(path_a_foo.c_str(), cache1.FindTemplateFilename(\"template_foo\").c_str()) == 0"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                        ,0x122,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
        }
LAB_00109ef5:
        std::__cxx11::string::~string((string *)&cache2);
      }
      this = &local_1e8;
    }
    else {
      printf("ASSERT FAILED, line %d: %s\n",0x116,
             "strcmp(path_b_bar.c_str(), cache1.FindTemplateFilename(\"template_bar\").c_str()) == 0"
            );
      std::__cxx11::string::string((string *)&path_a_foo,"template_bar",(allocator *)&path_b_foo);
      ctemplate::TemplateCache::FindTemplateFilename((string *)&cache2);
      iVar5 = strcmp(path_b_bar._M_dataplus._M_p,_cache2);
      if (iVar5 != 0) {
        __assert_fail("strcmp(path_b_bar.c_str(), cache1.FindTemplateFilename(\"template_bar\").c_str()) == 0"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                      ,0x116,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
      }
      std::__cxx11::string::~string((string *)&cache2);
      this = (TemplateString *)&path_a_foo;
    }
  }
  else {
    printf("ASSERT FAILED, line %d: %s\n",0x110,"cache1.template_root_directory() == pathA");
    ctemplate::TemplateCache::template_root_directory_abi_cxx11_();
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &cache2,&pathA);
    if (!_Var3) {
      __assert_fail("cache1.template_root_directory() == pathA",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x110,"static void TemplateCacheUnittest::TestTemplateSearchPath()");
    }
    this = (TemplateString *)&cache2;
  }
LAB_0010a05a:
  std::__cxx11::string::~string((string *)this);
LAB_0010a05f:
  exit(1);
}

Assistant:

static void TestTemplateSearchPath() {
    TemplateCache cache1;

    const string pathA = PathJoin(FLAGS_test_tmpdir, "a/");
    const string pathB = PathJoin(FLAGS_test_tmpdir, "b/");
    CreateOrCleanTestDir(pathA);
    CreateOrCleanTestDir(pathB);

    TemplateDictionary dict("");
    cache1.SetTemplateRootDirectory(pathA);
    cache1.AddAlternateTemplateRootDirectory(pathB);
    ASSERT(cache1.template_root_directory() == pathA);

    // 1. Show that a template in the secondary path can be found.
    const string path_b_bar = PathJoin(pathB, "template_bar");
    StringToFile("b/template_bar", path_b_bar);
    ASSERT_STREQ(path_b_bar.c_str(),
                 cache1.FindTemplateFilename("template_bar").c_str());
    const Template* b_bar = cache1.GetTemplate("template_bar", DO_NOT_STRIP);
    ASSERT(b_bar);
    AssertExpandIs(b_bar, &dict, "b/template_bar", true);

    // 2. Show that the search stops once the first match is found.
    //    Create two templates in separate directories with the same name.
    const string path_a_foo = PathJoin(pathA, "template_foo");
    const string path_b_foo = PathJoin(pathB, "template_foo");
    StringToFile("a/template_foo", path_a_foo);
    StringToFile("b/template_foo", path_b_foo);
    ASSERT_STREQ(path_a_foo.c_str(),
                 cache1.FindTemplateFilename("template_foo").c_str());
    const Template* a_foo = cache1.GetTemplate("template_foo", DO_NOT_STRIP);
    ASSERT(a_foo);
    AssertExpandIs(a_foo, &dict, "a/template_foo", true);

    // 3. Show that attempting to find a non-existent template gives an
    //    empty path.
    ASSERT(cache1.FindTemplateFilename("baz").empty());

    // 4. If we make a new cache, its path will be followed.
    TemplateCache cache2;
    cache2.SetTemplateRootDirectory(pathB);
    ASSERT_STREQ(path_b_foo.c_str(),
                 cache2.FindTemplateFilename("template_foo").c_str());
    const Template* b_foo = cache2.GetTemplate("template_foo", DO_NOT_STRIP);
    ASSERT(b_foo);
    AssertExpandIs(b_foo, &dict, "b/template_foo", true);

    // 5. Neither path will work for the default cache, which has no path.
    ASSERT(Template::template_root_directory() == kCWD);
    ASSERT(Template::FindTemplateFilename("template_foo").empty());
    ASSERT(!Template::GetTemplate("template_foo", DO_NOT_STRIP));

    CreateOrCleanTestDir(pathA);
    CreateOrCleanTestDir(pathB);
  }